

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O1

int run_test_tcp_create_early_bad_bind(void)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  ushort *puVar7;
  char *pcVar8;
  bool bVar9;
  uv_os_fd_t fd;
  int namelen;
  sockaddr_in6 sockname;
  sockaddr_in addr;
  uv_tcp_t client;
  undefined1 auStack_4b8 [16];
  undefined1 auStack_4a8 [248];
  char acStack_3b0 [248];
  char acStack_2b8 [96];
  code *pcStack_258;
  undefined1 auStack_248 [248];
  code *pcStack_150;
  int local_13c [2];
  int local_134 [7];
  undefined1 local_118 [16];
  long local_108 [31];
  
  pcStack_150 = (code *)0x172593;
  iVar2 = uv_interface_addresses(local_108,local_134);
  if (iVar2 != 0) {
LAB_001726ee:
    pcStack_150 = (code *)0x1726f3;
    run_test_tcp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)local_134[0] < 1) {
    pcStack_150 = (code *)0x1726ee;
    uv_free_interface_addresses();
    goto LAB_001726ee;
  }
  puVar7 = (ushort *)(local_108[0] + 0x14);
  uVar3 = 1;
  do {
    uVar1 = *puVar7;
    uVar5 = (ulong)uVar1;
    if (uVar1 == 10) break;
    puVar7 = puVar7 + 0x28;
    bVar9 = uVar3 < (ulong)(long)local_134[0];
    uVar3 = uVar3 + 1;
  } while (bVar9);
  pcStack_150 = (code *)0x1725da;
  uv_free_interface_addresses(local_108[0]);
  if (uVar1 != 10) goto LAB_001726ee;
  pcStack_150 = (code *)0x1725fa;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_118);
  if (iVar2 == 0) {
    pcStack_150 = (code *)0x172607;
    uVar4 = uv_default_loop();
    pcStack_150 = (code *)0x172619;
    iVar2 = uv_tcp_init_ex(uVar4,local_108,10);
    if (iVar2 != 0) goto LAB_001726ff;
    pcStack_150 = (code *)0x172630;
    iVar2 = uv_fileno(local_108,local_13c);
    if (iVar2 != 0) goto LAB_00172704;
    if (local_13c[0] == -1) goto LAB_00172709;
    local_13c[1] = 0x1c;
    pcStack_150 = (code *)0x17265d;
    iVar2 = uv_tcp_getsockname(local_108,local_134);
    if (iVar2 != 0) goto LAB_0017270e;
    if ((short)local_134[0] != 10) goto LAB_00172713;
    uVar5 = 0;
    pcStack_150 = (code *)0x172684;
    iVar2 = uv_tcp_bind(local_108,local_118,0);
    if (iVar2 != -0x16) goto LAB_00172718;
    pcStack_150 = (code *)0x172699;
    uv_close(local_108,0);
    pcStack_150 = (code *)0x17269e;
    uVar4 = uv_default_loop();
    pcStack_150 = (code *)0x1726a8;
    uv_run(uVar4,0);
    pcStack_150 = (code *)0x1726ad;
    uVar4 = uv_default_loop();
    pcStack_150 = (code *)0x1726c1;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_150 = (code *)0x1726cb;
    uv_run(uVar4,0);
    pcStack_150 = (code *)0x1726d0;
    uVar4 = uv_default_loop();
    pcStack_150 = (code *)0x1726d8;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_150 = (code *)0x1726ff;
    run_test_tcp_create_early_bad_bind_cold_2();
LAB_001726ff:
    pcStack_150 = (code *)0x172704;
    run_test_tcp_create_early_bad_bind_cold_3();
LAB_00172704:
    pcStack_150 = (code *)0x172709;
    run_test_tcp_create_early_bad_bind_cold_4();
LAB_00172709:
    pcStack_150 = (code *)0x17270e;
    run_test_tcp_create_early_bad_bind_cold_9();
LAB_0017270e:
    pcStack_150 = (code *)0x172713;
    run_test_tcp_create_early_bad_bind_cold_5();
LAB_00172713:
    pcStack_150 = (code *)0x172718;
    run_test_tcp_create_early_bad_bind_cold_6();
LAB_00172718:
    pcStack_150 = (code *)0x17271d;
    run_test_tcp_create_early_bad_bind_cold_7();
  }
  pcStack_150 = run_test_tcp_create_early_bad_domain;
  run_test_tcp_create_early_bad_bind_cold_8();
  pcStack_258 = (code *)0x17272f;
  pcStack_150 = (code *)uVar5;
  uVar4 = uv_default_loop();
  pcStack_258 = (code *)0x172741;
  iVar2 = uv_tcp_init_ex(uVar4,auStack_248,0x2f);
  if (iVar2 == -0x16) {
    pcStack_258 = (code *)0x17274b;
    uVar4 = uv_default_loop();
    pcStack_258 = (code *)0x17275d;
    iVar2 = uv_tcp_init_ex(uVar4,auStack_248,0x400);
    if (iVar2 != -0x16) goto LAB_001727b5;
    pcStack_258 = (code *)0x172767;
    uVar4 = uv_default_loop();
    pcStack_258 = (code *)0x172771;
    uv_run(uVar4,0);
    pcStack_258 = (code *)0x172776;
    uVar5 = uv_default_loop();
    pcStack_258 = (code *)0x17278a;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_258 = (code *)0x172794;
    uv_run(uVar5,0);
    pcStack_258 = (code *)0x172799;
    uVar4 = uv_default_loop();
    pcStack_258 = (code *)0x1727a1;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_258 = (code *)0x1727b5;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_001727b5:
    pcStack_258 = (code *)0x1727ba;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  pcStack_258 = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  pcStack_258 = (code *)uVar5;
  pcVar6 = (char *)uv_default_loop();
  pcVar8 = "0.0.0.0";
  iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_4a8);
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(pcVar6,acStack_3b0);
    pcVar8 = pcVar6;
    if (iVar2 != 0) goto LAB_001728ee;
    pcVar8 = acStack_3b0;
    iVar2 = uv_tcp_bind(pcVar8,auStack_4a8,0);
    if (iVar2 != 0) goto LAB_001728f3;
    pcVar8 = acStack_3b0;
    iVar2 = uv_listen(pcVar8,0x80,on_connection);
    if (iVar2 != 0) goto LAB_001728f8;
    pcVar6 = (char *)uv_default_loop();
    pcVar8 = "127.0.0.1";
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_4b8);
    if (iVar2 != 0) goto LAB_001728fd;
    iVar2 = uv_tcp_init(pcVar6,auStack_4a8);
    if (iVar2 != 0) goto LAB_00172902;
    pcVar6 = acStack_2b8;
    iVar2 = uv_tcp_connect(pcVar6,auStack_4a8,auStack_4b8,on_connect);
    if (iVar2 == 0) {
      uVar4 = uv_default_loop();
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      pcVar6 = (char *)uv_default_loop();
      iVar2 = uv_loop_close(pcVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017290c;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_001728ee:
    run_test_tcp_create_early_accept_cold_2();
LAB_001728f3:
    run_test_tcp_create_early_accept_cold_3();
LAB_001728f8:
    run_test_tcp_create_early_accept_cold_4();
LAB_001728fd:
    pcVar6 = pcVar8;
    run_test_tcp_create_early_accept_cold_5();
LAB_00172902:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_0017290c:
  run_test_tcp_create_early_accept_cold_8();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(pcVar6,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}